

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O2

void __thiscall
TreeDecomposition::updateNeighborSchema
          (TreeDecomposition *this,TDNode *node,size_t originID,size_t newAttrID)

{
  size_t sVar1;
  size_t c;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < node->_numOfNeighbors; uVar2 = uVar2 + 1) {
    sVar1 = (node->_neighbors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar2];
    if (sVar1 == originID) {
      std::bitset<100UL>::set
                ((bitset<100UL> *)
                 ((long)(node->_neighborSchema->super__Base_bitset<2UL>)._M_w + lVar3),newAttrID,
                 true);
    }
    else {
      updateNeighborSchema
                (this,(this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[sVar1],node->_id,newAttrID);
    }
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void TreeDecomposition::updateNeighborSchema(TDNode* node, size_t originID,
                                             size_t newAttrID)
{
    for (size_t c = 0; c < node->_numOfNeighbors; ++c)
    {        
        if (node->_neighbors[c] == originID)
            node->_neighborSchema[c].set(newAttrID);
        else
            updateNeighborSchema(getRelation(node->_neighbors[c]), node->_id, newAttrID);
    }
}